

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_push_unused(REF_NODE ref_node,REF_GLOB unused_global)

{
  int iVar1;
  uint uVar2;
  REF_GLOB *pRVar3;
  
  if (ref_node->max_unused == ref_node->n_unused) {
    ref_node->max_unused = ref_node->max_unused + 1000;
    fflush(_stdout);
    if (0 < (long)ref_node->max_unused) {
      pRVar3 = (REF_GLOB *)realloc(ref_node->unused_global,(long)ref_node->max_unused << 3);
      ref_node->unused_global = pRVar3;
    }
    if (ref_node->unused_global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x229,
             "ref_node_push_unused","realloc ref_node->unused_global NULL");
      uVar2 = ref_node->max_unused;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar2,
             (long)(int)uVar2,8,(long)(int)uVar2 * 8);
      return 2;
    }
  }
  iVar1 = ref_node->n_unused;
  ref_node->unused_global[iVar1] = unused_global;
  ref_node->n_unused = iVar1 + 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_push_unused(REF_NODE ref_node,
                                        REF_GLOB unused_global) {
  if (ref_node_max_unused(ref_node) == ref_node_n_unused(ref_node)) {
    ref_node_max_unused(ref_node) += 1000;
    ref_realloc(ref_node->unused_global, ref_node_max_unused(ref_node),
                REF_GLOB);
  }

  ref_node->unused_global[ref_node_n_unused(ref_node)] = unused_global;

  ref_node_n_unused(ref_node)++;

  return REF_SUCCESS;
}